

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * strPadLeft(string *__return_storage_ptr__,string *str,size_t newSize,char filler)

{
  int iVar1;
  int iVar2;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = (int)newSize - (int)str->_M_string_length;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (iVar2 != 0) {
    std::__cxx11::string::push_back((char)&local_48);
    iVar2 = iVar2 + -1;
  }
  std::operator+(__return_storage_ptr__,&local_48,str);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string strPadLeft(const string& str, const size_t newSize, const char filler)
{
    const int cnt = static_cast<int>(newSize - str.size());
    string prefix;
    for (int i = 0; i < cnt; i++) prefix += filler;
    return prefix + str;
}